

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::add_member_name(CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  mapped_type *pmVar1;
  Vector<Decoration> *this_00;
  size_t sVar2;
  ulong uVar3;
  Decoration *name_00;
  string *name;
  Vector<Decoration> *memb;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
  this_00 = &pmVar1->members;
  sVar2 = VectorView<spirv_cross::Meta::Decoration>::size
                    (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
  if (index < sVar2) {
    VectorView<spirv_cross::Meta::Decoration>::operator[]
              (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)index);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      name_00 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                          (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)index);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        ParsedIR::sanitize_identifier(&name_00->alias,true,true);
        Compiler::update_name_cache(&this->super_Compiler,&type->member_name_cache,&name_00->alias);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::add_member_name(SPIRType &type, uint32_t index)
{
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size() && !memb[index].alias.empty())
	{
		auto &name = memb[index].alias;
		if (name.empty())
			return;

		ParsedIR::sanitize_identifier(name, true, true);
		update_name_cache(type.member_name_cache, name);
	}
}